

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void int_cmov_test(void)

{
  int a;
  int r;
  int in_stack_00000014;
  int *in_stack_00000018;
  int *in_stack_00000020;
  
  secp256k1_int_cmov(in_stack_00000020,in_stack_00000018,in_stack_00000014);
  secp256k1_int_cmov(in_stack_00000020,in_stack_00000018,in_stack_00000014);
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c",
          0x1d5e,"test condition failed: r == INT_MAX");
  abort();
}

Assistant:

static void int_cmov_test(void) {
    int r = INT_MAX;
    int a = 0;

    secp256k1_int_cmov(&r, &a, 0);
    CHECK(r == INT_MAX);

    r = 0; a = INT_MAX;
    secp256k1_int_cmov(&r, &a, 1);
    CHECK(r == INT_MAX);

    a = 0;
    secp256k1_int_cmov(&r, &a, 1);
    CHECK(r == 0);

    a = 1;
    secp256k1_int_cmov(&r, &a, 1);
    CHECK(r == 1);

    r = 1; a = 0;
    secp256k1_int_cmov(&r, &a, 0);
    CHECK(r == 1);

}